

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_embedded_struct_array_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               size_t size,size_t count,flatcc_json_printer_struct_f *pf)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  char *pcVar6;
  
  if (index != 0) {
    pcVar6 = ctx->p;
    ctx->p = pcVar6 + 1;
    *pcVar6 = ',';
  }
  print_name(ctx,name,len);
  ctx->level = ctx->level + 1;
  pcVar6 = ctx->p;
  ctx->p = pcVar6 + 1;
  *pcVar6 = '[';
  if (count != 0) {
    sVar2 = 0;
    do {
      if (sVar2 != 0) {
        pcVar6 = ctx->p;
        ctx->p = pcVar6 + 1;
        *pcVar6 = ',';
      }
      ctx->level = ctx->level + 1;
      pcVar6 = ctx->p;
      ctx->p = pcVar6 + 1;
      *pcVar6 = '{';
      (*pf)(ctx,(void *)((long)p + sVar2 * size + offset));
      pcVar6 = ctx->p;
      if (ctx->indent != '\0') {
        ctx->p = pcVar6 + 1;
        *pcVar6 = '\n';
        lVar1 = (long)ctx->level + -1;
        ctx->level = (int)lVar1;
        uVar5 = (ulong)ctx->indent * lVar1;
        pcVar6 = ctx->pflush;
        pcVar3 = ctx->p;
        if (pcVar6 < pcVar3 + uVar5) {
          if (pcVar6 <= pcVar3) {
            (*ctx->flush)(ctx,0);
            pcVar6 = ctx->pflush;
            pcVar3 = ctx->p;
          }
          sVar4 = (long)pcVar6 - (long)pcVar3;
          if (sVar4 < uVar5) {
            do {
              memset(pcVar3,0x20,sVar4);
              ctx->p = ctx->p + sVar4;
              uVar5 = uVar5 - sVar4;
              (*ctx->flush)(ctx,0);
              pcVar3 = ctx->p;
              sVar4 = (long)ctx->pflush - (long)pcVar3;
            } while (sVar4 < uVar5);
          }
        }
        memset(pcVar3,0x20,uVar5);
        pcVar6 = ctx->p + uVar5;
      }
      ctx->p = pcVar6 + 1;
      *pcVar6 = '}';
      sVar2 = sVar2 + 1;
    } while (sVar2 != count);
  }
  pcVar6 = ctx->p;
  if (ctx->indent != '\0') {
    ctx->p = pcVar6 + 1;
    *pcVar6 = '\n';
    lVar1 = (long)ctx->level + -1;
    ctx->level = (int)lVar1;
    uVar5 = (ulong)ctx->indent * lVar1;
    pcVar6 = ctx->pflush;
    pcVar3 = ctx->p;
    if (pcVar6 < pcVar3 + uVar5) {
      if (pcVar6 <= pcVar3) {
        (*ctx->flush)(ctx,0);
        pcVar6 = ctx->pflush;
        pcVar3 = ctx->p;
      }
      sVar4 = (long)pcVar6 - (long)pcVar3;
      if (sVar4 < uVar5) {
        do {
          memset(pcVar3,0x20,sVar4);
          ctx->p = ctx->p + sVar4;
          uVar5 = uVar5 - sVar4;
          (*ctx->flush)(ctx,0);
          pcVar3 = ctx->p;
          sVar4 = (long)ctx->pflush - (long)pcVar3;
        } while (sVar4 < uVar5);
      }
    }
    memset(pcVar3,0x20,uVar5);
    pcVar6 = ctx->p + uVar5;
  }
  ctx->p = pcVar6 + 1;
  *pcVar6 = ']';
  return;
}

Assistant:

void flatcc_json_printer_embedded_struct_array_field(flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len,
        size_t size, size_t count,
        flatcc_json_printer_struct_f pf)
{
    size_t i;
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('[');
    for (i = 0; i < count; ++i) {
        if (i > 0) {
            print_char(',');
        }
        print_start('{');                                                   \
        pf(ctx, (uint8_t *)p + offset + i * size);
        print_end('}');
    }
    print_end(']');
}